

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bov.hpp
# Opt level: O0

void __thiscall
diy::io::BOV::set_shape<std::vector<int,std::allocator<int>>>
          (BOV *this,vector<int,_std::allocator<int>_> *shape)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  value_type vVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  size_type i_1;
  uint i;
  value_type_conflict5 *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  value_type_conflict *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined4 local_14;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a9101);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a910f);
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar2 <= local_14) break;
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_14);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_14 = local_14 + 1;
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  local_28 = sVar2 - 2;
  while (local_28 == 0) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),1);
    vVar5 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),1);
    iVar1 = *pvVar4;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),0);
    *pvVar3 = vVar5 * (long)iVar1;
    local_28 = -1;
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),1);
  vVar5 = *pvVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),1);
  vVar5 = vVar5 * (long)*pvVar4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),0);
  *pvVar3 = vVar5;
  return;
}

Assistant:

void          set_shape(const S& shape)
      {
        shape_.clear();
        stride_.clear();
        for (unsigned i = 0; i < shape.size(); ++i)
        {
            shape_.push_back(shape[i]);
            stride_.push_back(1);
        }
        for (auto i = shape_.size() - 2; i ==  0; --i)
          stride_[i] = stride_[i+1] * shape_[i+1];
        stride_[0] = stride_[1] * shape_[1];
      }